

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O1

double __thiscall ChebTools::ChebyshevExpansion::real_roots_time(ChebyshevExpansion *this,long N)

{
  long lVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> ypts;
  vector<double,_std::allocator<double>_> local_40;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  if (0 < N) {
    lVar2 = N;
    do {
      real_roots(&local_40,this,true);
      if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  return (((double)(lVar2 - lVar1) / 1000000000.0) / (double)N) * 1000000.0;
}

Assistant:

double ChebyshevExpansion::real_roots_time(long N) {
    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        auto ypts = real_roots();
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    return elap_us;
}